

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O0

void __thiscall
Encoder::TryCopyAndAddRelocRecordsForSwitchJumpTableEntries
          (Encoder *this,BYTE *codeStart,size_t codeSize,
          JmpTableList *jumpTableListForSwitchStatement,size_t totalJmpTableSizeInBytes)

{
  code *pcVar1;
  anon_class_16_2_7d23af4b map;
  bool bVar2;
  undefined4 *puVar3;
  EncoderMD *local_40;
  EncoderMD *encoderMD;
  BYTE *jmpTableStartAddress;
  size_t totalJmpTableSizeInBytes_local;
  JmpTableList *jumpTableListForSwitchStatement_local;
  size_t codeSize_local;
  BYTE *codeStart_local;
  Encoder *this_local;
  
  if (jumpTableListForSwitchStatement != (JmpTableList *)0x0) {
    encoderMD = (EncoderMD *)(codeStart + (codeSize - totalJmpTableSizeInBytes));
    local_40 = &this->m_encoderMD;
    map.encoderMD = &local_40;
    map.jmpTableStartAddress = (BYTE **)&encoderMD;
    jmpTableStartAddress = (BYTE *)totalJmpTableSizeInBytes;
    totalJmpTableSizeInBytes_local = (size_t)jumpTableListForSwitchStatement;
    jumpTableListForSwitchStatement_local = (JmpTableList *)codeSize;
    codeSize_local = (size_t)codeStart;
    codeStart_local = (BYTE *)this;
    JsUtil::
    List<BranchJumpTableWrapper*,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
    ::
    Map<Encoder::TryCopyAndAddRelocRecordsForSwitchJumpTableEntries(unsigned_char*,unsigned_long,JsUtil::List<BranchJumpTableWrapper*,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>*,unsigned_long)::__0>
              ((List<BranchJumpTableWrapper*,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
                *)jumpTableListForSwitchStatement,map);
    if (encoderMD !=
        (EncoderMD *)
        ((long)&(jumpTableListForSwitchStatement_local->
                super_ReadOnlyList<BranchJumpTableWrapper_*,_Memory::ArenaAllocator,_DefaultComparer>
                )._vptr_ReadOnlyList + codeSize_local)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                         ,0x3e6,"(jmpTableStartAddress == codeStart + codeSize)",
                         "jmpTableStartAddress == codeStart + codeSize");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
  }
  return;
}

Assistant:

void Encoder::TryCopyAndAddRelocRecordsForSwitchJumpTableEntries(BYTE *codeStart, size_t codeSize, JmpTableList * jumpTableListForSwitchStatement, size_t totalJmpTableSizeInBytes)
{
    if (jumpTableListForSwitchStatement == nullptr)
    {
        return;
    }

    BYTE * jmpTableStartAddress = codeStart + codeSize - totalJmpTableSizeInBytes;
    EncoderMD * encoderMD = &m_encoderMD;

    jumpTableListForSwitchStatement->Map([&](uint index, BranchJumpTableWrapper * branchJumpTableWrapper) -> void
    {
        Assert(branchJumpTableWrapper != nullptr);

        void ** srcJmpTable = branchJumpTableWrapper->jmpTable;
        size_t jmpTableSizeInBytes = branchJumpTableWrapper->tableSize * sizeof(void*);

        AssertMsg(branchJumpTableWrapper->labelInstr != nullptr, "Label not yet created?");
        Assert(branchJumpTableWrapper->labelInstr->GetPC() == nullptr);

        branchJumpTableWrapper->labelInstr->SetPC(jmpTableStartAddress);
        memcpy(jmpTableStartAddress, srcJmpTable, jmpTableSizeInBytes);

        for (int i = 0; i < branchJumpTableWrapper->tableSize; i++)
        {
            void * addressOfJmpTableEntry = jmpTableStartAddress + (i * sizeof(void*));
            Assert((ptrdiff_t) addressOfJmpTableEntry - (ptrdiff_t) jmpTableStartAddress < (ptrdiff_t) jmpTableSizeInBytes);
#if defined(_M_ARM32_OR_ARM64)
            encoderMD->AddLabelReloc((byte*) addressOfJmpTableEntry);
#else
            encoderMD->AppendRelocEntry(RelocTypeLabelUse, addressOfJmpTableEntry, *(IR::LabelInstr**)addressOfJmpTableEntry);
            *((size_t*)addressOfJmpTableEntry) = 0;
#endif
        }

        jmpTableStartAddress += (jmpTableSizeInBytes);
    });

    Assert(jmpTableStartAddress == codeStart + codeSize);
}